

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_NtkPrintStats(Au_Ntk_t *p)

{
  int iVar1;
  
  printf("%-30s:",p->pName);
  printf(" i/o =%6d/%6d",(ulong)(uint)p->nObjs[2],(ulong)(uint)p->nObjs[3]);
  if (p->nObjs[5] != 0) {
    printf("  lat =%5d");
  }
  printf("  nd =%6d",(ulong)(uint)p->nObjs[7]);
  printf("  box =%5d",(ulong)(uint)p->nObjs[6]);
  printf("  obj =%7d",(ulong)(uint)(p->vObjs).nSize);
  iVar1 = (p->vPages).nSize * 0x1000 + p->iHandle + -0x1000;
  printf(" %5.1f %%",((double)(iVar1 - (p->vObjs).nSize) * 100.0) / (double)iVar1);
  printf(" %6.1f MB",
         (double)(p->nObjsAlloc * 0x10 + ((p->vPos).nCap + (p->vPis).nCap + (p->vObjs).nCap) * 4 +
                 0x100) * 9.5367431640625e-07);
  printf(" %5.1f %%",((double)(p->nObjsAlloc - p->nObjsUsed) * 100.0) / (double)p->nObjsAlloc);
  putchar(10);
  return;
}

Assistant:

void Au_NtkPrintStats( Au_Ntk_t * p )
{
    printf( "%-30s:",        Au_NtkName(p) );
    printf( " i/o =%6d/%6d", Au_NtkPiNum(p), Au_NtkPoNum(p) );
    if ( Au_NtkFlopNum(p) )
        printf( "  lat =%5d",    Au_NtkFlopNum(p) );
    printf( "  nd =%6d",     Au_NtkNodeNum(p) );
//    if ( Au_NtkBoxNum(p) )
        printf( "  box =%5d",    Au_NtkBoxNum(p) );
    printf( "  obj =%7d",    Au_NtkObjNum(p) );
//    printf( "  max =%7d",    Au_NtkObjNumMax(p) );
//    printf( "  use =%7d",    p->nObjsUsed );
    printf( " %5.1f %%",     100.0 * (Au_NtkObjNumMax(p) - Au_NtkObjNum(p)) / Au_NtkObjNumMax(p) );
    printf( " %6.1f MB",     1.0 * Au_NtkMemUsage(p) / (1 << 20) );
    printf( " %5.1f %%",     100.0 * (p->nObjsAlloc - p->nObjsUsed) / p->nObjsAlloc );
    printf( "\n" );
}